

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::process
          (actual_elapsed_timers_collector_t *this)

{
  demands_container_t *this_00;
  _Elt_pointer pdVar1;
  abstract_message_box_t *paVar2;
  _Map_pointer ppdVar3;
  size_t sVar4;
  _Elt_pointer pdVar5;
  _Elt_pointer pdVar6;
  _Elt_pointer pdVar7;
  _Map_pointer ppdVar8;
  _Map_pointer ppdVar9;
  _Elt_pointer pdVar10;
  demand_t *d;
  _Elt_pointer pdVar11;
  _Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  local_78;
  
  pdVar11 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar1 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar11 != pdVar1) {
    pdVar10 = (this->m_demands).
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppdVar9 = (this->m_demands).
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      paVar2 = (pdVar11->m_mbox).m_obj;
      (*paVar2->_vptr_abstract_message_box_t[0xb])(paVar2,pdVar11,&pdVar11->m_message);
      pdVar11 = pdVar11 + 1;
      if (pdVar11 == pdVar10) {
        pdVar11 = ppdVar9[1];
        ppdVar9 = ppdVar9 + 1;
        pdVar10 = pdVar11 + 0x15;
      }
    } while (pdVar11 != pdVar1);
  }
  this_00 = &this->m_demands;
  ppdVar9 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (((long)(this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
      ((long)(this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
      (((long)ppdVar9 -
        (long)(this->m_demands).
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppdVar9 == (_Map_pointer)0x0)) * 0x15 < 1000) {
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::clear(this_00);
    return;
  }
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::
  _Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::_M_initialize_map(&local_78,0);
  ppdVar3 = (this_00->
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            )._M_impl.super__Deque_impl_data._M_map;
  sVar4 = (this->m_demands).
          super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  pdVar11 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar1 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
  pdVar10 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppdVar9 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar5 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pdVar6 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pdVar7 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
  ppdVar8 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  (this_00->
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  )._M_impl.super__Deque_impl_data._M_map = local_78._M_impl.super__Deque_impl_data._M_map;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_map_size = local_78._M_impl.super__Deque_impl_data._M_map_size;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       local_78._M_impl.super__Deque_impl_data._M_start._M_first;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       local_78._M_impl.super__Deque_impl_data._M_start._M_last;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node =
       local_78._M_impl.super__Deque_impl_data._M_start._M_node;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       local_78._M_impl.super__Deque_impl_data._M_finish._M_first;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       local_78._M_impl.super__Deque_impl_data._M_finish._M_last;
  (this->m_demands).
  super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node =
       local_78._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78._M_impl.super__Deque_impl_data._M_map = ppdVar3;
  local_78._M_impl.super__Deque_impl_data._M_map_size = sVar4;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = pdVar11;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = pdVar1;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = pdVar10;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = ppdVar9;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar5;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = pdVar6;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = pdVar7;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = ppdVar8;
  std::
  deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::~deque((deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            *)&local_78);
  return;
}

Assistant:

void
		process()
			{
				for( auto & d : m_demands )
				{
					so_5::rt::impl::mbox_iface_for_timers_t{ d.m_mbox }
							.deliver_message_from_timer( d.m_type_index, d.m_message );
				}

				// A defense from cases where were too many timers.
				if( m_demands.size() < 1000 )
					// A simple clean is enough.
					m_demands.clear();
				else
					{
						// Old container must be utilized.
						demands_container_t demands;
						demands.swap( m_demands );
					}
			}